

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_single_cubemap_from_memory
               (uchar *buffer,int buffer_length,char *face_order,int force_channels,
               uint reuse_texture_ID,uint flags)

{
  int iVar1;
  uchar *puVar2;
  long in_RDX;
  long in_RDI;
  uint in_R9D;
  char *unaff_retaddr;
  uint tex_id;
  int i;
  int channels;
  int height;
  int width;
  uchar *img;
  int in_stack_000000b8;
  int in_stack_000000bc;
  uint in_stack_000000c0;
  int in_stack_000000c4;
  uchar *in_stack_000000c8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  int buffer_length_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_fffffffffffffffc;
  uint uVar5;
  
  buffer_length_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI == 0) {
    result_string_pointer = "Invalid single cube map buffer";
    uVar5 = 0;
  }
  else if (((in_R9D & 0x40) == 0) ||
          (uVar5 = SOIL_direct_load_DDS_from_memory
                             (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,
                              in_stack_000000bc,in_stack_000000b8), uVar5 == 0)) {
    uVar3 = 0;
    for (iVar4 = 0; iVar4 < 6; iVar4 = iVar4 + 1) {
      if (((((*(char *)(in_RDX + iVar4) != 'N') && (*(char *)(in_RDX + iVar4) != 'S')) &&
           (*(char *)(in_RDX + iVar4) != 'W')) &&
          ((*(char *)(in_RDX + iVar4) != 'E' && (*(char *)(in_RDX + iVar4) != 'U')))) &&
         (*(char *)(in_RDX + iVar4) != 'D')) {
        result_string_pointer = "Invalid single cube map face order";
        return 0;
      }
    }
    iVar1 = query_cubemap_capability();
    if (iVar1 == 1) {
      puVar2 = SOIL_load_image_from_memory
                         ((uchar *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),buffer_length_00,
                          (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int *)CONCAT44(in_stack_ffffffffffffffbc,iVar4),
                          (int *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
                         );
      if (puVar2 == (uchar *)0x0) {
        result_string_pointer = stbi_failure_reason();
        uVar5 = 0;
      }
      else if ((in_stack_ffffffffffffffc4 == in_stack_ffffffffffffffc0 * 6) ||
              (in_stack_ffffffffffffffc4 * 6 == in_stack_ffffffffffffffc0)) {
        uVar5 = SOIL_create_OGL_single_cubemap
                          (_height,channels,i,tex_id,unaff_retaddr,in_stack_fffffffffffffffc,
                           reuse_texture_ID);
        SOIL_free_image_data((uchar *)0x117ae1);
      }
      else {
        SOIL_free_image_data((uchar *)0x117a91);
        result_string_pointer = "Single cubemap image must have a 6:1 ratio";
        uVar5 = 0;
      }
    }
    else {
      result_string_pointer = "No cube map capability present";
      uVar5 = 0;
    }
  }
  return uVar5;
}

Assistant:

unsigned int
	SOIL_load_OGL_single_cubemap_from_memory
	(
		const unsigned char *const buffer,
		int buffer_length,
		const char face_order[6],
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels, i;
	unsigned int tex_id = 0;
	/*	error checking	*/
	if( buffer == NULL )
	{
		result_string_pointer = "Invalid single cube map buffer";
		return 0;
	}
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS_from_memory(
				buffer, buffer_length,
				reuse_texture_ID, flags, 1 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	face order checking	*/
	for( i = 0; i < 6; ++i )
	{
		if( (face_order[i] != 'N') &&
			(face_order[i] != 'S') &&
			(face_order[i] != 'W') &&
			(face_order[i] != 'E') &&
			(face_order[i] != 'U') &&
			(face_order[i] != 'D') )
		{
			result_string_pointer = "Invalid single cube map face order";
			return 0;
		};
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st off, try to load the full image	*/
	img = SOIL_load_image_from_memory(
			buffer, buffer_length,
			&width, &height, &channels,
			force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	now, does this image have the right dimensions?	*/
	if( (width != 6*height) &&
		(6*width != height) )
	{
		SOIL_free_image_data( img );
		result_string_pointer = "Single cubemap image must have a 6:1 ratio";
		return 0;
	}
	/*	try the image split and create	*/
	tex_id = SOIL_create_OGL_single_cubemap(
			img, width, height, channels,
			face_order, reuse_texture_ID, flags
			);
	/*	nuke the temporary image data and return the texture handle	*/
	SOIL_free_image_data( img );
	return tex_id;
}